

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O2

Var Js::HelperMethodWrapper9
              (ScriptContext *scriptContext,void *origHelperAddr,Var arg1,Var arg2,Var arg3,Var arg4
              ,Var arg5,Var arg6,Var arg7,Var arg8,Var arg9)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  long lVar5;
  anon_class_80_10_d03270b8 *paVar6;
  anon_class_80_10_d03270b8 *paVar7;
  byte bVar8;
  anon_class_80_10_d03270b8 local_e8;
  anon_class_80_10_d03270b8 local_98;
  Var local_48;
  ScriptContext *local_40;
  AutoRegisterIgnoreExceptionWrapper local_38;
  
  bVar8 = 0;
  if (origHelperAddr == (void *)0x0) {
    AssertCount = AssertCount + 1;
    local_48 = arg4;
    local_40 = scriptContext;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0x92,"(origHelperAddr)","origHelperAddr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    arg4 = local_48;
    scriptContext = local_40;
  }
  local_98.arg5 = arg5;
  local_98.arg6 = arg6;
  local_98.arg7 = arg7;
  local_98.arg8 = arg8;
  local_98.arg9 = arg9;
  local_98.origHelperAddr = origHelperAddr;
  local_98.arg1 = arg1;
  local_98.arg2 = arg2;
  local_98.arg3 = arg3;
  local_98.arg4 = arg4;
  bVar2 = AutoRegisterIgnoreExceptionWrapper::IsRegistered(scriptContext->threadContext);
  if (bVar2) {
    pvVar4 = HelperMethodWrapper9::anon_class_80_10_d03270b8::operator()(&local_98);
  }
  else {
    AutoRegisterIgnoreExceptionWrapper::AutoRegisterIgnoreExceptionWrapper
              (&local_38,scriptContext->threadContext);
    paVar6 = &local_98;
    paVar7 = &local_e8;
    for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
      paVar7->origHelperAddr = paVar6->origHelperAddr;
      paVar6 = (anon_class_80_10_d03270b8 *)((long)paVar6 + ((ulong)bVar8 * -2 + 1) * 8);
      paVar7 = (anon_class_80_10_d03270b8 *)((long)paVar7 + (ulong)bVar8 * -0x10 + 8);
    }
    pvVar4 = HelperMethodWrapper9::anon_class_80_10_d03270b8::operator()(&local_e8);
    AutoRegisterIgnoreExceptionWrapper::~AutoRegisterIgnoreExceptionWrapper(&local_38);
  }
  return pvVar4;
}

Assistant:

Var HelperMethodWrapper9(ScriptContext* scriptContext, void* origHelperAddr, Var arg1, Var arg2, Var arg3, Var arg4, Var arg5, Var arg6, Var arg7, Var arg8, Var arg9)
    {
        Assert(origHelperAddr);
        return HelperMethodWrapper(scriptContext, [=] {
            return ((OrigHelperMethod9)origHelperAddr)(arg1, arg2, arg3, arg4, arg5, arg6, arg7, arg8, arg9);
        });
    }